

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressor.h
# Opt level: O0

void __thiscall
ScriptCompression::Unser<AutoFile>(ScriptCompression *this,AutoFile *s,CScript *script)

{
  undefined8 in_RDX;
  CScript *in_RSI;
  long in_FS_OFFSET;
  uint nSize;
  CompressedScript vch;
  uint in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  prevector<33U,_unsigned_char,_unsigned_int,_int> *in_stack_ffffffffffffff50;
  AutoFile *in_stack_ffffffffffffff58;
  AutoFile *this_00;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  uint nSize_00;
  AutoFile local_30;
  
  nSize_00 = (uint)((ulong)in_RDX >> 0x20);
  local_30.m_position.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._8_8_ = *(long *)(in_FS_OFFSET + 0x28);
  Using<VarIntFormatter<(VarIntMode)0>,unsigned_int&>((uint *)in_stack_ffffffffffffff50);
  AutoFile::operator>>
            (in_stack_ffffffffffffff58,
             (Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_int_&> *)in_stack_ffffffffffffff50);
  GetSpecialScriptSize(in_stack_ffffffffffffff48);
  this_00 = &local_30;
  prevector<33U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<33U,_unsigned_char,_unsigned_int,_int> *)this_00,
             (size_type)((ulong)in_stack_ffffffffffffff50 >> 0x20),
             (uchar *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  Span<unsigned_char>::Span<prevector<33u,unsigned_char,unsigned_int,int>>
            ((Span<unsigned_char> *)this_00,in_stack_ffffffffffffff50,
             (type)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  AutoFile::operator>>(this_00,(Span<unsigned_char> *)in_stack_ffffffffffffff50);
  DecompressScript(in_RSI,nSize_00,
                   (CompressedScript *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)
                  );
  prevector<33U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<33U,_unsigned_char,_unsigned_int,_int> *)
             CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  if (*(long *)(in_FS_OFFSET + 0x28) !=
      local_30.m_position.super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._8_8_) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Unser(Stream &s, CScript& script) {
        unsigned int nSize = 0;
        s >> VARINT(nSize);
        if (nSize < nSpecialScripts) {
            CompressedScript vch(GetSpecialScriptSize(nSize), 0x00);
            s >> Span{vch};
            DecompressScript(script, nSize, vch);
            return;
        }
        nSize -= nSpecialScripts;
        if (nSize > MAX_SCRIPT_SIZE) {
            // Overly long script, replace with a short invalid one
            script << OP_RETURN;
            s.ignore(nSize);
        } else {
            script.resize(nSize);
            s >> Span{script};
        }
    }